

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPoolInline.h
# Opt level: O0

sbfPoolItem sbfPoolNew(sbfPool pool)

{
  u_int *puVar1;
  sbfPoolItem psVar2;
  sbfPool in_RDI;
  sbfPoolItem item;
  
  LOCK();
  puVar1 = &in_RDI->mCount->mNews;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  psVar2 = (sbfPoolItem)sbfMemory_malloc(in_RDI->mSize);
  psVar2->mPool = in_RDI;
  psVar2->mNext = (sbfPoolItemImpl *)0x0;
  return psVar2;
}

Assistant:

static SBF_INLINE sbfPoolItem
sbfPoolNew (sbfPool pool)
{
    sbfPoolItem item;

#ifdef WIN32
    InterlockedIncrement (&pool->mCount->mNews);
#else
    __sync_fetch_and_add (&pool->mCount->mNews, 1);
#endif

    item = (sbfPoolItem)xmalloc (pool->mSize);
    item->mPool = pool;
    item->mNext = NULL;
    return item;
}